

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarCase::initPrograms
          (ComputeBuiltinVarCase *this,SourceCollections *programCollection)

{
  DataType dataType;
  ostream *poVar1;
  ProgramSources *this_00;
  char *pcVar2;
  ulong uVar3;
  char *local_3a8 [4];
  string local_388;
  undefined1 local_368 [40];
  string local_340;
  ostringstream name;
  ostringstream local_1a8 [376];
  
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(this->m_subCases).
                             super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_subCases).
                            super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    poVar1 = std::operator<<((ostream *)&name,
                             (string *)
                             compute::(anonymous_namespace)::s_prefixProgramName_abi_cxx11_);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                        (&programCollection->glslSources,&local_388);
    dataType = this->m_varType;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar1 = std::operator<<((ostream *)local_1a8,"#version 310 es\n");
    poVar1 = std::operator<<(poVar1,"layout (local_size_x = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", local_size_y = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", local_size_z = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,") in;\n");
    poVar1 = std::operator<<(poVar1,"layout(set = 0, binding = 0) uniform Stride\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,"\tuvec2 u_stride;\n");
    poVar1 = std::operator<<(poVar1,"}stride;\n");
    poVar1 = std::operator<<(poVar1,"layout(set = 0, binding = 1, std430) buffer Output\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,"\t");
    pcVar2 = glu::getDataTypeName(dataType);
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1," result[];\n");
    poVar1 = std::operator<<(poVar1,"} sb_out;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"void main (void)\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,
                             "\thighp uint offset = stride.u_stride.x*gl_GlobalInvocationID.z + stride.u_stride.y*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                            );
    poVar1 = std::operator<<(poVar1,"\tsb_out.result[offset] = ");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_varName);
    poVar1 = std::operator<<(poVar1,";\n");
    std::operator<<(poVar1,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,local_3a8[0],(allocator<char> *)local_1a8);
    glu::ComputeSource::ComputeSource((ComputeSource *)local_368,&local_340);
    glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_368);
    std::__cxx11::string::~string((string *)(local_368 + 8));
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)local_3a8);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  }
  return;
}

Assistant:

void ComputeBuiltinVarCase::initPrograms (SourceCollections& programCollection) const
{
	for (std::size_t i = 0; i < m_subCases.size(); i++)
	{
		const SubCase&	subCase = m_subCases[i];
		std::ostringstream name;
		name << s_prefixProgramName << i;
		programCollection.glslSources.add(name.str()) << glu::ComputeSource(genBuiltinVarSource(m_varName, m_varType, subCase.localSize()).c_str());
	}
}